

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdump.cpp
# Opt level: O3

void mmdump(int f,uint64_t offset,uint64_t length,uint64_t step,uint64_t width,int access,
           int mmapmode)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined4 in_register_0000008c;
  long lVar3;
  uint8_t *src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  mappedmem m;
  allocator_type local_a8 [24];
  uint64_t local_90;
  ulong local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  ulong local_68;
  ulong local_60;
  uint64_t local_58;
  mappedmem local_50;
  
  local_68 = CONCAT44(in_register_0000008c,access);
  local_90 = offset;
  mappedmem::mappedmem(&local_50,f,offset,length + offset,mmapmode);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,width,local_a8);
  if (0 < (long)length) {
    src = local_50.pmem + local_50.dataofs;
    puVar2 = src + length;
    local_88 = local_68 & 0xffffffff;
    lVar3 = -(long)src;
    local_60 = (ulong)((int)local_68 - 1);
    local_58 = length;
    do {
      puVar2 = puVar2 + lVar3;
      puVar1 = (uint8_t *)width;
      if (puVar2 < width) {
        puVar1 = puVar2;
      }
      copydata(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,src,(int)puVar1,(int)local_68);
      if (puVar2 < width) {
        memset(puVar1 + (long)local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0,width - (long)puVar1);
      }
      if ((uint)local_60 < 8) {
        (*(code *)(&DAT_0010a024 + *(int *)(&DAT_0010a024 + local_60 * 4)))();
        return;
      }
      local_90 = local_90 + step;
      src = src + step;
      puVar2 = local_50.pmem + local_58 + local_50.dataofs;
      lVar3 = lVar3 - step;
    } while (src < puVar2);
  }
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  mappedmem::~mappedmem(&local_50);
  return;
}

Assistant:

void mmdump(int f, uint64_t offset, uint64_t length, uint64_t step, uint64_t width, int access, int mmapmode)
{
    mappedmem m(f, offset, offset+length, mmapmode);

    std::vector<uint8_t> data(width);
    for (uint8_t *p= m.data() ; p<m.data()+length ; p+=step)
    {
        uint64_t want= std::min((uint64_t)(m.data()+length-p), width);
        copydata(&data[0], p, want, access);
        if (want<width)
            std::fill(&data[want], &data[width], 0);
        switch(access)
        {
        case 1: print("%08llx: %b", offset, std::vector<uint8_t>(&data[0], &data[0]+width/access));
        case 2: print("%08llx: %b", offset, std::vector<uint16_t>(&data[0], &data[0]+width/access));
        case 4: print("%08llx: %b", offset, std::vector<uint32_t>(&data[0], &data[0]+width/access));
        case 8: print("%08llx: %b", offset, std::vector<uint64_t>(&data[0], &data[0]+width/access));
        }

        offset += step;
    }
}